

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

uint64_t __thiscall
leveldb::VersionSet::ApproximateOffsetOf(VersionSet *this,Version *v,InternalKey *ikey)

{
  pointer ppFVar1;
  FileMetaData *pFVar2;
  Table *this_00;
  int iVar3;
  Iterator *pIVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  size_t i;
  ulong uVar7;
  long lVar8;
  _Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *p_Var9;
  long in_FS_OFFSET;
  Table *tableptr;
  ReadOptions local_50;
  Table *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar8 = 0;
  uVar6 = 0;
  do {
    if (lVar8 == 7) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return uVar6;
    }
    p_Var9 = &v->files_[lVar8].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>;
    for (uVar7 = 0; ppFVar1 = (p_Var9->_M_impl).super__Vector_impl_data._M_start,
        uVar7 < (ulong)((long)(p_Var9->_M_impl).super__Vector_impl_data._M_finish - (long)ppFVar1 >>
                       3); uVar7 = uVar7 + 1) {
      iVar3 = InternalKeyComparator::Compare(&this->icmp_,&ppFVar1[uVar7]->largest,ikey);
      pFVar2 = (p_Var9->_M_impl).super__Vector_impl_data._M_start[uVar7];
      if (iVar3 < 1) {
        uVar6 = uVar6 + pFVar2->file_size;
      }
      else {
        iVar3 = InternalKeyComparator::Compare(&this->icmp_,&pFVar2->smallest,ikey);
        if (iVar3 < 1) {
          local_50 = (ReadOptions)ZEXT216(0x100);
          pFVar2 = (p_Var9->_M_impl).super__Vector_impl_data._M_start[uVar7];
          pIVar4 = TableCache::NewIterator
                             (this->table_cache_,&local_50,pFVar2->number,pFVar2->file_size,
                              &local_40);
          this_00 = local_40;
          if (local_40 != (Table *)0x0) {
            local_50 = (ReadOptions)InternalKey::Encode(ikey);
            uVar5 = Table::ApproximateOffsetOf(this_00,(Slice *)&local_50);
            uVar6 = uVar6 + uVar5;
          }
          if (pIVar4 != (Iterator *)0x0) {
            (*pIVar4->_vptr_Iterator[1])(pIVar4);
          }
        }
        else if (lVar8 != 0) break;
      }
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

uint64_t VersionSet::ApproximateOffsetOf(Version* v, const InternalKey& ikey) {
  uint64_t result = 0;
  for (int level = 0; level < config::kNumLevels; level++) {
    const std::vector<FileMetaData*>& files = v->files_[level];
    for (size_t i = 0; i < files.size(); i++) {
      if (icmp_.Compare(files[i]->largest, ikey) <= 0) {
        // Entire file is before "ikey", so just add the file size
        result += files[i]->file_size;
      } else if (icmp_.Compare(files[i]->smallest, ikey) > 0) {
        // Entire file is after "ikey", so ignore
        if (level > 0) {
          // Files other than level 0 are sorted by meta->smallest, so
          // no further files in this level will contain data for
          // "ikey".
          break;
        }
      } else {
        // "ikey" falls in the range for this table.  Add the
        // approximate offset of "ikey" within the table.
        Table* tableptr;
        Iterator* iter = table_cache_->NewIterator(
            ReadOptions(), files[i]->number, files[i]->file_size, &tableptr);
        if (tableptr != nullptr) {
          result += tableptr->ApproximateOffsetOf(ikey.Encode());
        }
        delete iter;
      }
    }
  }
  return result;
}